

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_get_proc_index(Integer g_a,Integer iproc,Integer *index)

{
  short sVar1;
  global_array_t *pgVar2;
  long lVar3;
  long lVar4;
  
  pgVar2 = GA;
  if (GA[g_a + 1000].distr_type - 3U < 2) {
    sVar1 = GA[g_a + 1000].ndim;
    lVar3 = iproc % (long)GA[g_a + 1000].nblock[0];
    *index = lVar3;
    lVar4 = 0;
    while (lVar4 + 1 < (long)sVar1) {
      iproc = (iproc - lVar3) / (long)pgVar2[g_a + 1000].nblock[lVar4];
      lVar3 = iproc % (long)pgVar2[g_a + 1000].nblock[lVar4 + 1];
      index[lVar4 + 1] = lVar3;
      lVar4 = lVar4 + 1;
    }
  }
  else {
    if (GA[g_a + 1000].distr_type != 2) {
      pnga_error("Global array does not use ScaLAPACK data distribution",0);
      return;
    }
    sVar1 = GA[g_a + 1000].ndim;
    lVar3 = iproc % (long)GA[g_a + 1000].nblock[0];
    *index = lVar3;
    lVar4 = 0;
    while (lVar4 + 1 < (long)sVar1) {
      iproc = (iproc - lVar3) / (long)pgVar2[g_a + 1000].nblock[lVar4];
      lVar3 = iproc % (long)pgVar2[g_a + 1000].nblock[lVar4 + 1];
      index[lVar4 + 1] = lVar3;
      lVar4 = lVar4 + 1;
    }
  }
  return;
}

Assistant:

void pnga_get_proc_index(Integer g_a, Integer iproc, Integer *index)
{
  Integer ga_handle = GA_OFFSET + g_a;
  if (GA[ga_handle].distr_type == SCALAPACK) {
    gam_find_proc_indices(ga_handle, iproc, index);
  } else if (GA[ga_handle].distr_type == TILED ||
      GA[ga_handle].distr_type == TILED_IRREG) {
    gam_find_tile_proc_indices(ga_handle, iproc, index);
  } else {
    pnga_error("Global array does not use ScaLAPACK data distribution",0);
  }
  return;
}